

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O3

int __thiscall
QDateTimeParser::findDay
          (QDateTimeParser *this,QStringView str,int startDay,int sectionIndex,QString *usedDay,
          int *used)

{
  int iVar1;
  SectionNode *pSVar2;
  int iVar3;
  long in_FS_OFFSET;
  QLocale l;
  QString local_1a8;
  QLocale local_190;
  QVLABase<QString> local_188;
  QString local_170 [13];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = sectionNode(this,sectionIndex);
  if ((pSVar2->type & DaySectionMask) == NoSection) {
    findDay();
    iVar1 = -1;
    goto LAB_0040b0d3;
  }
  iVar1 = pSVar2->count;
  local_190.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
  (*this->_vptr_QDateTimeParser[6])(&local_190,this);
  memset(local_170,0xaa,0x138);
  local_188.super_QVLABaseBase.a = 0xd;
  local_188.super_QVLABaseBase.s = 0;
  iVar3 = startDay;
  local_188.super_QVLABaseBase.ptr = local_170;
  if (startDay < -5) {
    QVLABase<QString>::reallocate_impl(&local_188,0xd,local_170,0,(ulong)(8 - startDay));
LAB_0040b01b:
    do {
      QLocale::dayName(&local_1a8,&local_190,iVar3,(uint)(iVar1 != 4));
      QVLABase<QString>::emplace_back_impl<QString>(&local_188,0xd,local_170,&local_1a8);
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 8);
  }
  else if (startDay < 8) goto LAB_0040b01b;
  iVar1 = findTextEntry(str,(ShortVector<QString> *)local_188.super_QVLABaseBase.s,
                        (QString *)local_188.super_QVLABaseBase.ptr,(int *)usedDay);
  if (iVar1 < 0) {
    startDay = 0;
  }
  std::_Destroy_n_aux<false>::__destroy_n<QString*,long_long>
            ((QString *)local_188.super_QVLABaseBase.ptr,local_188.super_QVLABaseBase.s);
  if ((QString *)local_188.super_QVLABaseBase.ptr != local_170) {
    QtPrivate::sizedFree(local_188.super_QVLABaseBase.ptr,local_188.super_QVLABaseBase.a * 0x18);
  }
  iVar1 = startDay + iVar1;
  QLocale::~QLocale(&local_190);
LAB_0040b0d3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTimeParser::findDay(QStringView str, int startDay, int sectionIndex, QString *usedDay, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (!(sn.type & DaySectionMask)) {
        qWarning("QDateTimeParser::findDay Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 4 ? QLocale::LongFormat : QLocale::ShortFormat;
    QLocale l = locale();
    ShortVector<QString> daysOfWeek;
    daysOfWeek.reserve(8 - startDay);
    for (int day = startDay; day <= 7; ++day)
        daysOfWeek.append(l.dayName(day, type));

    const int index = findTextEntry(str, daysOfWeek, usedDay, used);
    return index < 0 ? index : index + startDay;
}